

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcCallContext::RpcCallContext
          (RpcCallContext *this,RpcConnectionState *connectionState,AnswerId answerId)

{
  uint *puVar1;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *pMVar2;
  size_t sVar3;
  Array<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> local_38;
  
  (this->super_Refcounted).refcount = 0;
  (this->super_CallContextHook)._vptr_CallContextHook = (_func_int **)&PTR_getParams_006cf680;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_006cf6e0;
  puVar1 = &(connectionState->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  (this->connectionState).disposer = &(connectionState->super_Refcounted).super_Disposer;
  (this->connectionState).ptr = connectionState;
  this->answerId = answerId;
  (this->hints).noPromisePipelining = false;
  (this->hints).onlyPromisePipeline = false;
  this->interfaceId = 0;
  this->methodId = 0;
  this->requestSize = 0;
  (this->request).ptr.disposer = (Disposer *)0x0;
  (this->request).ptr.ptr = (IncomingRpcMessage *)0x0;
  local_38.disposer = (ArrayDisposer *)0x0;
  local_38.ptr = (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0;
  local_38.size_ = 0;
  ReaderCapabilityTable::ReaderCapabilityTable(&this->paramsCapTable,&local_38);
  sVar3 = local_38.size_;
  pMVar2 = local_38.ptr;
  if (local_38.ptr != (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0) {
    local_38.ptr = (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0;
    local_38.size_ = 0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,pMVar2,0x10,sVar3,sVar3,
               kj::ArrayDisposer::Dispose_<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>
               ::destruct);
  }
  (this->params).reader.segment = (SegmentReader *)0x0;
  (this->params).reader.capTable = (CapTableReader *)0x0;
  (this->params).reader.pointer = (WirePointer *)0x0;
  (this->params).reader.nestingLimit = 0x7fffffff;
  this->redirectResults = false;
  this->responseSent = false;
  (this->response).ptr.disposer = (Disposer *)0x0;
  (this->response).ptr.ptr = (RpcServerResponse *)0x0;
  (this->returnMessage)._builder.segment = (SegmentBuilder *)0x0;
  (this->returnMessage)._builder.capTable = (CapTableBuilder *)0x0;
  (this->returnMessage)._builder.data = (void *)0x0;
  (this->returnMessage)._builder.pointers = (WirePointer *)0x0;
  (this->tailCallPipelineFulfiller).ptr.disposer = (Disposer *)0x0;
  (this->tailCallPipelineFulfiller).ptr.ptr = (PromiseFulfiller<capnp::AnyPointer::Pipeline> *)0x0;
  this->receivedFinish = false;
  kj::UnwindDetector::UnwindDetector(&this->unwindDetector);
  return;
}

Assistant:

RpcCallContext(RpcConnectionState& connectionState, AnswerId answerId)
        : connectionState(kj::addRef(connectionState)),
          answerId(answerId),
          interfaceId(0),
          methodId(0),
          requestSize(0),
          paramsCapTable(nullptr),
          returnMessage(nullptr),
          redirectResults(false) {}